

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaxtpeek.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uStack_48;
  int s;
  uint32_t z [4];
  int local_2c;
  int ls;
  int32_t i;
  int32_t b;
  int32_t a;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar3 = nva_init();
  if (iVar3 == 0) {
    b = 0;
    while (a = getopt((int)argv_local,_cnum,"c:"), a != -1) {
      if (a == 99) {
        __isoc99_sscanf(_optarg,"%d",&b);
      }
    }
    if (b < nva_cardsnum) {
      ls = 4;
      if (_optind < (int)argv_local) {
        __isoc99_sscanf(_cnum[_optind],"%x",&i);
        if (_optind + 1 < (int)argv_local) {
          __isoc99_sscanf(_cnum[_optind + 1],"%x",&ls);
        }
        nva_wr32(b,0x1700,0x30);
        bVar2 = true;
        for (; 0 < ls; ls = ls + -0x10) {
          bVar1 = false;
          for (local_2c = 0; local_2c < 0x10 && local_2c < ls; local_2c = local_2c + 4) {
            uVar4 = xt_rd32(b,i + local_2c);
            (&uStack_48)[local_2c / 4] = uVar4;
            if (uVar4 != 0) {
              bVar1 = true;
            }
          }
          if (bVar1) {
            bVar2 = true;
            printf("%08x:",(ulong)(uint)i);
            for (local_2c = 0; local_2c < 0x10 && local_2c < ls; local_2c = local_2c + 4) {
              printf(" %08x",(ulong)(&uStack_48)[local_2c / 4],(long)local_2c % 4 & 0xffffffff);
            }
            printf("\n");
          }
          else if (bVar2) {
            printf("...\n");
            bVar2 = false;
          }
          i = i + 0x10;
        }
        argv_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"No address specified.\n");
        argv_local._4_4_ = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	nva_wr32(cnum, 0x1700, 0x30);
	int ls = 1;
	while (b > 0) {
		uint32_t z[4];
		int s = 0;
		for (i = 0; i < 16 && i < b; i+=4)
			if ((z[i/4] = xt_rd32(cnum, a+i))) s = 1;
		if (s) {
			ls = 1;
			printf ("%08x:", a);
			for (i = 0; i < 16 && i < b; i+=4) {
				printf (" %08x", z[i/4]);
			}
			printf ("\n");
		} else  {
			if (ls) printf ("...\n"), ls = 0;
		}
		a+=16;
		b-=16;
	}
	return 0;
}